

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_hash.c
# Opt level: O2

ion_err_t linear_hash_increment_num_records(linear_hash_table_t *linear_hash)

{
  ion_boolean_t iVar1;
  ion_err_t iVar2;
  
  linear_hash->num_records = linear_hash->num_records + 1;
  iVar1 = linear_hash_above_threshold(linear_hash);
  if (iVar1 == '\0') {
    iVar2 = '\0';
  }
  else {
    iVar2 = write_new_bucket(linear_hash->num_buckets,linear_hash);
    if (iVar2 == '\0') {
      linear_hash_increment_num_buckets(linear_hash);
      iVar2 = split(linear_hash);
      return iVar2;
    }
  }
  return iVar2;
}

Assistant:

ion_err_t
linear_hash_increment_num_records(
	linear_hash_table_t *linear_hash
) {
	linear_hash->num_records++;

	ion_err_t err = err_ok;

	if (linear_hash_above_threshold(linear_hash)) {
		err = write_new_bucket(linear_hash->num_buckets, linear_hash);

		if (err != err_ok) {
			return err;
		}

		linear_hash_increment_num_buckets(linear_hash);
		err = split(linear_hash);
	}

	return err;
}